

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStreamClient.cpp
# Opt level: O0

Output_GetSegmentStaticScale * __thiscall
ViconDataStreamSDK::CPP::Client::GetSegmentStaticScale
          (Output_GetSegmentStaticScale *__return_storage_ptr__,Client *this,String *SubjectName,
          String *SegmentName)

{
  Enum i_Result;
  Enum EVar1;
  element_type *this_00;
  string local_60;
  string local_40;
  String *local_20;
  String *SegmentName_local;
  String *SubjectName_local;
  Client *this_local;
  
  local_20 = SegmentName;
  SegmentName_local = SubjectName;
  SubjectName_local = (String *)this;
  this_00 = std::
            __shared_ptr_access<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this->m_pClientImpl);
  String::operator_cast_to_string(&local_40,SegmentName_local);
  String::operator_cast_to_string(&local_60,local_20);
  i_Result = Core::VClient::GetSegmentStaticScale
                       (this_00,&local_40,&local_60,&__return_storage_ptr__->Scale);
  EVar1 = Adapt(i_Result);
  __return_storage_ptr__->Result = EVar1;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

CLASS_DECLSPEC
    Output_GetSegmentStaticScale Client::GetSegmentStaticScale(const String & SubjectName,
      const String & SegmentName) const
  {
    Output_GetSegmentStaticScale Output;
    Output.Result = Adapt(m_pClientImpl->m_pCoreClient->GetSegmentStaticScale(SubjectName,
      SegmentName,
      Output.Scale));

    return Output;
  }